

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

LoopHandle __thiscall
gmlc::networking::AsioContextManager::startContextLoop(AsioContextManager *this)

{
  bool bVar1;
  undefined1 uVar2;
  io_context *processReturn;
  long in_RSI;
  __uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
  in_RDI;
  packaged_task<void_()> *this_00;
  thread contextThread_1;
  packaged_task<void_()> contextTask_1;
  unique_lock<std::mutex> nullLock_1;
  thread contextThread;
  unique_lock<std::mutex> nullLock;
  packaged_task<void_()> contextTask;
  loop_mode exp;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  mutex_type *in_stack_fffffffffffffe58;
  unique_lock<std::mutex> *in_stack_fffffffffffffe60;
  shared_future<void> *in_stack_fffffffffffffe68;
  shared_future<void> *__sf;
  packaged_task<void_()> *in_stack_fffffffffffffe70;
  io_context *in_stack_fffffffffffffe78;
  shared_future<void> *in_stack_fffffffffffffe80;
  packaged_task<void_()> *in_stack_fffffffffffffe88;
  packaged_task<void_()> *this_01;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  io_context *in_stack_fffffffffffffe98;
  shared_future<void> local_100;
  unique_lock<std::mutex> local_f0;
  packaged_task<void_()> local_d8 [11];
  undefined4 local_24;
  
  std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RSI + 0x18));
  std::enable_shared_from_this<gmlc::networking::AsioContextManager>::shared_from_this
            ((enable_shared_from_this<gmlc::networking::AsioContextManager> *)
             in_stack_fffffffffffffe58);
  local_24 = 0;
  bVar1 = std::atomic<gmlc::networking::AsioContextManager::loop_mode>::compare_exchange_strong
                    ((atomic<gmlc::networking::AsioContextManager::loop_mode> *)
                     in_stack_fffffffffffffe80,(loop_mode *)in_stack_fffffffffffffe78,
                     (loop_mode)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (memory_order)in_stack_fffffffffffffe70);
  if (bVar1) {
    std::shared_ptr<gmlc::networking::AsioContextManager>::shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffe60,
               (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffe58);
    std::packaged_task<void()>::
    packaged_task<gmlc::networking::AsioContextManager::startContextLoop()::__0,void>
              ((packaged_task<void_()> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (anon_class_16_1_ba1d6e4e_for__M_fn *)in_stack_fffffffffffffe88);
    startContextLoop()::$_0::~__0((anon_class_16_1_ba1d6e4e_for__M_fn *)0x75edcb);
    std::unique_lock<std::mutex>::unique_lock(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    getBaseContext((AsioContextManager *)0x75edf3);
    std::make_unique<asio::io_context::work,asio::io_context&>(in_stack_fffffffffffffe78);
    std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::operator=
              ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
               in_stack_fffffffffffffe60,
               (unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
               in_stack_fffffffffffffe58);
    std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
    ~unique_ptr((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
                in_stack_fffffffffffffe60);
    std::packaged_task<void_()>::get_future(in_stack_fffffffffffffe88);
    std::future<void>::share((future<void> *)in_stack_fffffffffffffe58);
    std::shared_future<void>::operator=
              ((shared_future<void> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x75ee94);
    std::future<void>::~future((future<void> *)0x75ee9e);
    std::shared_future<void>::shared_future
              ((shared_future<void> *)in_stack_fffffffffffffe60,
               (shared_future<void> *)in_stack_fffffffffffffe58);
    storeFuture(in_stack_fffffffffffffe80);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x75eece);
    std::unique_lock<std::mutex>::unlock(in_stack_fffffffffffffe60);
    std::thread::thread<std::packaged_task<void()>,,void>
              ((thread *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    std::thread::detach();
    std::thread::~thread((thread *)0x75ef10);
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe60);
    std::packaged_task<void_()>::~packaged_task(in_stack_fffffffffffffe70);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe98 = getBaseContext((AsioContextManager *)0x75f00c);
    uVar2 = asio::io_context::stopped((io_context *)0x75f01d);
    if ((bool)uVar2) {
      bVar1 = std::__basic_future<void>::valid((__basic_future<void> *)0x75f044);
      if (bVar1) {
        std::shared_future<void>::get((shared_future<void> *)0x75f05e);
      }
      std::unique_lock<std::mutex>::unlock(in_stack_fffffffffffffe60);
      local_24 = 0;
      bVar1 = std::atomic<gmlc::networking::AsioContextManager::loop_mode>::compare_exchange_strong
                        ((atomic<gmlc::networking::AsioContextManager::loop_mode> *)
                         in_stack_fffffffffffffe80,(loop_mode *)in_stack_fffffffffffffe78,
                         (loop_mode)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                         (memory_order)in_stack_fffffffffffffe70);
      if (bVar1) {
        this_01 = local_d8;
        std::shared_ptr<gmlc::networking::AsioContextManager>::shared_ptr
                  ((shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffe60,
                   (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffe58);
        std::packaged_task<void()>::
        packaged_task<gmlc::networking::AsioContextManager::startContextLoop()::__1,void>
                  ((packaged_task<void_()> *)CONCAT17(uVar2,in_stack_fffffffffffffe90),
                   (anon_class_16_1_ba1d6e4e_for__M_fn *)this_01);
        startContextLoop()::$_1::~__1((anon_class_16_1_ba1d6e4e_for__M_fn *)0x75f115);
        std::unique_lock<std::mutex>::lock(in_stack_fffffffffffffe60);
        processReturn = getBaseContext((AsioContextManager *)0x75f131);
        std::make_unique<asio::io_context::work,asio::io_context&>(in_stack_fffffffffffffe78);
        std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
        operator=((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                   *)in_stack_fffffffffffffe60,
                  (unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                   *)in_stack_fffffffffffffe58);
        std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
        ~unique_ptr((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                     *)in_stack_fffffffffffffe60);
        std::packaged_task<void_()>::get_future(this_01);
        in_stack_fffffffffffffe60 = &local_f0;
        __sf = &local_100;
        std::shared_future<void>::shared_future
                  ((shared_future<void> *)in_stack_fffffffffffffe60,
                   (future<void> *)in_stack_fffffffffffffe58);
        this_00 = (packaged_task<void_()> *)(in_RSI + 0x88);
        std::shared_future<void>::operator=((shared_future<void> *)this_00,__sf);
        std::shared_future<void>::~shared_future((shared_future<void> *)0x75f1d2);
        std::future<void>::~future((future<void> *)0x75f1dc);
        std::shared_future<void>::shared_future
                  ((shared_future<void> *)in_stack_fffffffffffffe60,
                   (shared_future<void> *)in_stack_fffffffffffffe58);
        storeFuture((shared_future<void> *)processReturn);
        std::shared_future<void>::~shared_future((shared_future<void> *)0x75f20c);
        std::unique_lock<std::mutex>::unlock(in_stack_fffffffffffffe60);
        std::thread::thread<std::packaged_task<void()>,,void>
                  ((thread *)CONCAT17(uVar2,in_stack_fffffffffffffe90),this_01);
        std::thread::detach();
        std::thread::~thread((thread *)0x75f24e);
        std::packaged_task<void_()>::~packaged_task(this_00);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffe60);
  }
  std::
  make_unique<gmlc::networking::AsioContextManager::Servicer,std::shared_ptr<gmlc::networking::AsioContextManager>>
            ((shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffe98);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x75f32d);
  return (__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
          )(tuple<gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
            )in_RDI.
             super___uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
             .super__Head_base<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_false>.
             _M_head_impl;
}

Assistant:

AsioContextManager::LoopHandle AsioContextManager::startContextLoop()
{
    ++runCounter;  // atomic
    auto ptr = shared_from_this();
    loop_mode exp = loop_mode::stopped;
    if (running.compare_exchange_strong(exp, loop_mode::starting)) {
        std::packaged_task<void()> contextTask(
            [ptr]() { contextProcessingLoop(ptr); });
        //   std::cout << "run Context loop " << runCounter << "\n";
        std::unique_lock<std::mutex> nullLock(runningLoopLock);

        nullwork = std::make_unique<asio::io_context::work>(getBaseContext());
        loopRet = contextTask.get_future().share();
        AsioContextManager::storeFuture(loopRet);
        nullLock.unlock();
        std::thread contextThread(std::move(contextTask));
        contextThread.detach();
        //  std::cout << "starting context loop thread " << runCounter << "\n";
    } else {
        std::unique_lock<std::mutex> nullLock(runningLoopLock);
        if (getBaseContext().stopped()) {
            // std::cout << "run Context loop already stopped" << runCounter <<
            // "\n";
            if (loopRet.valid()) {
                loopRet.get();
            }
            nullLock.unlock();
            exp = loop_mode::stopped;
            if (running.compare_exchange_strong(exp, loop_mode::starting)) {
                std::packaged_task<void()> contextTask(
                    [ptr]() { contextProcessingLoop(ptr); });
                nullLock.lock();
                nullwork =
                    std::make_unique<asio::io_context::work>(getBaseContext());
                loopRet = contextTask.get_future();
                AsioContextManager::storeFuture(loopRet);
                nullLock.unlock();
                std::thread contextThread(std::move(contextTask));
                contextThread.detach();
            }
        }
    }
    return std::make_unique<Servicer>(std::move(ptr));
}